

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dauCanon.c
# Opt level: O2

Abc_TtHieMan_t * Abc_TtHieManStart(int nVars,int nLevels)

{
  int nCap;
  Abc_TtHieMan_t *pAVar1;
  Vec_Mem_t *pVVar2;
  Vec_Int_t *pVVar3;
  int iVar4;
  ulong uVar5;
  ulong uVar6;
  
  uVar6 = 0;
  if (nLevels < 6) {
    pAVar1 = (Abc_TtHieMan_t *)calloc(1,0x78);
    pAVar1->nLastLevel = nLevels + -1;
    iVar4 = 1 << ((char)nVars - 6U & 0x1f);
    if (nVars < 7) {
      iVar4 = 1;
    }
    pAVar1->nWords = iVar4;
    uVar5 = (ulong)(uint)nLevels;
    if (nLevels < 1) {
      uVar5 = uVar6;
    }
    for (; uVar5 != uVar6; uVar6 = uVar6 + 1) {
      pVVar2 = (Vec_Mem_t *)calloc(1,0x30);
      pVVar2->nEntrySize = iVar4;
      pVVar2->LogPageSze = 0xc;
      pVVar2->PageMask = 0xfff;
      pVVar2->iPage = -1;
      pAVar1->vTtMem[uVar6] = pVVar2;
      nCap = Abc_PrimeCudd(10000);
      pVVar3 = Vec_IntAlloc(nCap);
      pVVar3->nSize = nCap;
      if (pVVar3->pArray != (int *)0x0) {
        memset(pVVar3->pArray,0xff,(long)nCap << 2);
      }
      pVVar2->vTable = pVVar3;
      pVVar3 = Vec_IntAlloc(10000);
      pVVar2->vNexts = pVVar3;
      pVVar3 = Vec_IntAlloc(1);
      pAVar1->vRepres[uVar6] = pVVar3;
    }
    pVVar3 = Vec_IntAlloc(0x9c4);
    pAVar1->vPhase = pVVar3;
  }
  else {
    pAVar1 = (Abc_TtHieMan_t *)0x0;
  }
  return pAVar1;
}

Assistant:

Abc_TtHieMan_t * Abc_TtHieManStart(int nVars, int nLevels)
{
    Abc_TtHieMan_t * p = NULL;
    int i;
    if (nLevels > TT_MAX_LEVELS) return p;
    p = ABC_CALLOC(Abc_TtHieMan_t, 1);
    p->nLastLevel = nLevels - 1;
    p->nWords = Abc_TtWordNum(nVars);
    for (i = 0; i < nLevels; i++)
    {
        p->vTtMem[i] = Vec_MemAlloc(p->nWords, 12);
        Vec_MemHashAlloc(p->vTtMem[i], 10000);
        p->vRepres[i] = Vec_IntAlloc(1);
    }
    p->vPhase = Vec_IntAlloc(2500);
    return p;
}